

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RewardModelDiscreteInterface.h
# Opt level: O2

void __thiscall RewardModelDiscreteInterface::Print(RewardModelDiscreteInterface *this)

{
  string asStack_28 [32];
  
  (*(this->super_QTableInterface)._vptr_QTableInterface[5])(asStack_28,this);
  std::operator<<((ostream *)&std::cout,asStack_28);
  std::__cxx11::string::~string(asStack_28);
  return;
}

Assistant:

void Print() const
        { std::cout << SoftPrint();}